

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressImpl(LineTable *this,SectionedAddress Address)

{
  uint32_t uVar1;
  const_iterator Seq;
  undefined1 local_50 [8];
  Sequence Sequence;
  
  DWARFDebugLine::Sequence::Sequence((Sequence *)local_50);
  Sequence.LowPC = Address.Address;
  Sequence.HighPC = Address.SectionIndex;
  Seq = upper_bound<std::vector<llvm::DWARFDebugLine::Sequence,std::allocator<llvm::DWARFDebugLine::Sequence>>const&,llvm::DWARFDebugLine::Sequence&,bool(*)(llvm::DWARFDebugLine::Sequence_const&,llvm::DWARFDebugLine::Sequence_const&)>
                  (&this->Sequences,(Sequence *)local_50,DWARFDebugLine::Sequence::orderByHighPC);
  if ((Seq._M_current ==
       (this->Sequences).
       super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((Seq._M_current)->SectionIndex != Address.SectionIndex)) {
    uVar1 = this->UnknownRowIndex;
  }
  else {
    uVar1 = findRowInSeq(this,Seq._M_current,Address);
  }
  return uVar1;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddressImpl(
    object::SectionedAddress Address) const {
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter It = llvm::upper_bound(Sequences, Sequence,
                                      DWARFDebugLine::Sequence::orderByHighPC);
  if (It == Sequences.end() || It->SectionIndex != Address.SectionIndex)
    return UnknownRowIndex;
  return findRowInSeq(*It, Address);
}